

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined4 in_register_0000003c;
  
  lVar2 = cmime_string_list_new(CONCAT44(in_register_0000003c,argc));
  cmime_string_list_insert(lVar2,test_string1);
  cmime_string_list_insert(lVar2,test_string2);
  cmime_string_list_insert(lVar2,test_string3);
  if (*(int *)(lVar2 + 8) != 3) {
    __assert_fail("cmime_string_list_get_count(sl)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                  ,0x2c,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_string_list_get(lVar2,0);
  iVar1 = strcmp(pcVar3,test_string1);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,test_string1)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                  ,0x2f,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_string_list_get(lVar2,1);
  iVar1 = strcmp(pcVar3,test_string2);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,test_string2)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                  ,0x32,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_string_list_get(lVar2,2);
  iVar1 = strcmp(pcVar3,test_string3);
  if (iVar1 == 0) {
    cmime_string_list_free(lVar2);
    pcVar3 = (char *)cmime_string_strip(test_string4);
    iVar1 = strcmp(pcVar3,test_string3);
    if (iVar1 != 0) {
      __assert_fail("strcmp(s,test_string3)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                    ,0x3b,"int main(int, const char **)");
    }
    pcVar3 = (char *)cmime_string_encode_to_7bit(mime_header_string1,0);
    iVar1 = strcmp(pcVar3,mime_header_string1_b64_encoded);
    if (iVar1 == 0) {
      free(pcVar3);
      pcVar3 = (char *)cmime_string_encode_to_7bit(mime_header_string1,1);
      iVar1 = strcmp(pcVar3,mime_header_string1_qp_encoded);
      if (iVar1 == 0) {
        free(pcVar3);
        return 0;
      }
      __assert_fail("strcmp(out,mime_header_string1_qp_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                    ,0x43,"int main(int, const char **)");
    }
    __assert_fail("strcmp(out,mime_header_string1_b64_encoded)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                  ,0x3f,"int main(int, const char **)");
  }
  __assert_fail("strcmp(s,test_string3)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_string.c"
                ,0x35,"int main(int, const char **)");
}

Assistant:

int main (int argc, char const *argv[]) {
    CMimeStringList_T *sl;
    
    char *s = NULL;
    char *out = NULL;
    
    sl = cmime_string_list_new();
    
    cmime_string_list_insert(sl,test_string1);
    cmime_string_list_insert(sl,test_string2);
    cmime_string_list_insert(sl,test_string3);
    assert(cmime_string_list_get_count(sl)==3);
        
    s = cmime_string_list_get(sl,0);
    assert(strcmp(s,test_string1)==0);
    
    s = cmime_string_list_get(sl,1);
    assert(strcmp(s,test_string2)==0);
    
    s = cmime_string_list_get(sl,2);
    assert(strcmp(s,test_string3)==0);
    
    cmime_string_list_free(sl);
    
    // check string strip
    s = cmime_string_strip(test_string4);
    assert(strcmp(s,test_string3)==0);
	
    // check mime encoding
    out = cmime_string_encode_to_7bit(mime_header_string1,CMIME_STRING_ENCODING_B64);
    assert(strcmp(out,mime_header_string1_b64_encoded)==0);
    free(out);

    out = cmime_string_encode_to_7bit(mime_header_string1,CMIME_STRING_ENCODING_QP);
    assert(strcmp(out,mime_header_string1_qp_encoded)==0);
    free(out);

    return(0);
}